

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  RtreeNode *pRVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  if (0 < iHeight) {
    pRVar2 = nodeHashLookup(pRtree,iRowid);
    if (pRVar2 != (RtreeNode *)0x0) {
      nodeRelease(pRtree,pRVar2->pParent);
      if (pNode != (RtreeNode *)0x0) {
        pNode->nRef = pNode->nRef + 1;
      }
      pRVar2->pParent = pNode;
    }
  }
  UNRECOVERED_JUMPTABLE = parentWrite;
  if (iHeight == 0) {
    UNRECOVERED_JUMPTABLE = rowidWrite;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pRtree,iRowid,pNode->iNode,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

static int updateMapping(
  Rtree *pRtree, 
  i64 iRowid, 
  RtreeNode *pNode, 
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}